

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O1

MPP_RET process_subsps(H264_SLICE_t *currSlice)

{
  size_t sVar1;
  bitread_ctx_t *p_bitctx;
  int iVar2;
  h264d_cur_ctx_t *phVar3;
  H264_subSPS_t *subset_sps;
  uint uVar4;
  ulong size;
  MPP_RET MVar5;
  MPP_RET MVar6;
  h264_subsps_t *phVar7;
  h264_subsps_t *phVar8;
  RK_S32 *pRVar9;
  RK_S32 **ppRVar10;
  char *fmt;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  RK_S32 _out;
  uint local_44;
  ulong local_40;
  size_t local_38;
  
  phVar3 = currSlice->p_Cur;
  p_bitctx = &phVar3->bitctx;
  if (phVar3->subsps == (h264_subsps_t *)0x0) {
    phVar7 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
    currSlice->p_Cur->subsps = phVar7;
  }
  phVar7 = currSlice->p_Cur->subsps;
  MVar6 = MPP_OK;
  memset(phVar7,0,0x10c0);
  phVar7->num_views_minus1 = -1;
  phVar7->num_level_values_signalled_minus1 = -1;
  MVar5 = parser_sps(p_bitctx,&phVar7->sps,currSlice->p_Dec);
  if (MVar5 < MPP_OK) {
    uVar12 = 0x224;
    MVar6 = MVar5;
    goto joined_r0x00190285;
  }
  iVar2 = (phVar7->sps).profile_idc;
  if ((iVar2 == 0x80) || (iVar2 == 0x76)) {
    MVar6 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_44);
    (phVar3->bitctx).ret = MVar6;
    if (MVar6 == MPP_OK) {
      phVar7->bit_equal_to_one = local_44;
      if ((local_44 != 1 && ((byte)h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "cur_subsps->bit_equal_to_one == 1","parser_subsps_ext",0x179),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      MVar6 = mpp_read_ue(p_bitctx,&local_44);
      uVar4 = local_44;
      (phVar3->bitctx).ret = MVar6;
      if (MVar6 == MPP_OK) {
        uVar13 = (ulong)local_44;
        phVar7->num_views_minus1 = local_44;
        if ((int)local_44 < 0x10) {
          if (-1 < (int)local_44) {
            sVar1 = uVar13 * 4 + 4;
            local_40 = sVar1;
            pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",sVar1);
            phVar7->view_id = pRVar9;
            pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",sVar1);
            phVar7->num_anchor_refs_l0 = pRVar9;
            pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",sVar1);
            phVar7->num_anchor_refs_l1 = pRVar9;
            sVar1 = uVar13 * 8 + 8;
            local_38 = sVar1;
            ppRVar10 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",sVar1);
            phVar7->anchor_ref_l0 = ppRVar10;
            ppRVar10 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",sVar1);
            size = local_40;
            phVar7->anchor_ref_l1 = ppRVar10;
            pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",local_40);
            phVar7->num_non_anchor_refs_l0 = pRVar9;
            pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            sVar1 = local_38;
            phVar7->num_non_anchor_refs_l1 = pRVar9;
            ppRVar10 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",local_38);
            phVar7->non_anchor_ref_l0 = ppRVar10;
            ppRVar10 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",sVar1);
            phVar7->non_anchor_ref_l1 = ppRVar10;
            if ((((((phVar7->view_id == (RK_S32 *)0x0) ||
                   (phVar7->num_anchor_refs_l0 == (RK_S32 *)0x0)) ||
                  (phVar7->num_anchor_refs_l1 == (RK_S32 *)0x0)) ||
                 ((phVar7->anchor_ref_l0 == (RK_S32 **)0x0 ||
                  (phVar7->anchor_ref_l1 == (RK_S32 **)0x0)))) ||
                ((phVar7->num_non_anchor_refs_l0 == (RK_S32 *)0x0 ||
                 ((phVar7->num_non_anchor_refs_l1 == (RK_S32 *)0x0 ||
                  (phVar7->non_anchor_ref_l0 == (RK_S32 **)0x0)))))) || (ppRVar10 == (RK_S32 **)0x0)
               ) {
              MVar6 = MPP_ERR_MALLOC;
              if (((byte)h264d_debug & 1) != 0) {
                fmt = "malloc buffer error(%d).\n";
                uVar12 = 0x141;
                goto LAB_00190910;
              }
              goto LAB_00190362;
            }
          }
          local_40 = uVar13;
          if (-1 < (int)uVar4) {
            lVar11 = 0;
            do {
              MVar6 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) goto LAB_0019035a;
              phVar7->view_id[lVar11] = local_44;
              lVar11 = lVar11 + 1;
            } while (uVar13 + 1 != lVar11);
          }
          if ((int)local_40 < 1) {
            MVar6 = MPP_OK;
          }
          else {
            local_40 = (ulong)((int)local_40 + 1);
            uVar13 = 1;
            do {
              MVar6 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) goto LAB_0019035a;
              pRVar9 = phVar7->num_anchor_refs_l0;
              pRVar9[uVar13] = local_44;
              lVar11 = (long)pRVar9[uVar13];
              if (lVar11 != 0) {
                pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar11 << 2);
                phVar7->anchor_ref_l0[uVar13] = pRVar9;
                if (phVar7->anchor_ref_l0[uVar13] == (RK_S32 *)0x0) {
                  MVar6 = MPP_ERR_MALLOC;
                  if (((byte)h264d_debug & 1) == 0) goto LAB_00190362;
                  fmt = "malloc buffer error(%d).\n";
                  uVar12 = 0x14a;
                  goto LAB_00190910;
                }
                if (0 < phVar7->num_anchor_refs_l0[uVar13]) {
                  lVar11 = 0;
                  do {
                    MVar6 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar6;
                    if (MVar6 != MPP_OK) goto LAB_0019035a;
                    phVar7->anchor_ref_l0[uVar13][lVar11] = local_44;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < phVar7->num_anchor_refs_l0[uVar13]);
                }
              }
              MVar6 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) goto LAB_0019035a;
              pRVar9 = phVar7->num_anchor_refs_l1;
              pRVar9[uVar13] = local_44;
              lVar11 = (long)pRVar9[uVar13];
              if (lVar11 != 0) {
                pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar11 << 2);
                phVar7->anchor_ref_l1[uVar13] = pRVar9;
                if (phVar7->anchor_ref_l1[uVar13] == (RK_S32 *)0x0) {
                  MVar6 = MPP_ERR_MALLOC;
                  if (((byte)h264d_debug & 1) == 0) goto LAB_00190362;
                  fmt = "malloc buffer error(%d).\n";
                  uVar12 = 0x152;
                  goto LAB_00190910;
                }
                if (0 < phVar7->num_anchor_refs_l1[uVar13]) {
                  lVar11 = 0;
                  do {
                    MVar6 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar6;
                    if (MVar6 != MPP_OK) goto LAB_0019035a;
                    phVar7->anchor_ref_l1[uVar13][lVar11] = local_44;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < phVar7->num_anchor_refs_l1[uVar13]);
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != local_40);
            uVar13 = 1;
            do {
              MVar6 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) goto LAB_0019035a;
              pRVar9 = phVar7->num_non_anchor_refs_l0;
              pRVar9[uVar13] = local_44;
              lVar11 = (long)pRVar9[uVar13];
              if (lVar11 != 0) {
                pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar11 << 2);
                phVar7->non_anchor_ref_l0[uVar13] = pRVar9;
                if (phVar7->non_anchor_ref_l0[uVar13] == (RK_S32 *)0x0) {
                  MVar6 = MPP_ERR_MALLOC;
                  if (((byte)h264d_debug & 1) != 0) {
                    fmt = "malloc buffer error(%d).\n";
                    uVar12 = 0x15c;
                    goto LAB_00190910;
                  }
                  break;
                }
                if (0 < phVar7->num_non_anchor_refs_l0[uVar13]) {
                  lVar11 = 0;
                  do {
                    MVar6 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar6;
                    if (MVar6 != MPP_OK) goto LAB_0019035a;
                    phVar7->non_anchor_ref_l0[uVar13][lVar11] = local_44;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < phVar7->num_non_anchor_refs_l0[uVar13]);
                }
              }
              MVar6 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar6;
              if (MVar6 != MPP_OK) goto LAB_0019035a;
              pRVar9 = phVar7->num_non_anchor_refs_l1;
              pRVar9[uVar13] = local_44;
              lVar11 = (long)pRVar9[uVar13];
              if (lVar11 != 0) {
                pRVar9 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar11 << 2);
                phVar7->non_anchor_ref_l1[uVar13] = pRVar9;
                if (phVar7->non_anchor_ref_l1[uVar13] == (RK_S32 *)0x0) {
                  MVar6 = MPP_ERR_MALLOC;
                  if (((byte)h264d_debug & 1) != 0) {
                    fmt = "malloc buffer error(%d).\n";
                    uVar12 = 0x164;
                    goto LAB_00190910;
                  }
                  break;
                }
                if (0 < phVar7->num_non_anchor_refs_l1[uVar13]) {
                  lVar11 = 0;
                  do {
                    MVar6 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar6;
                    if (MVar6 != MPP_OK) goto LAB_0019035a;
                    phVar7->non_anchor_ref_l1[uVar13][lVar11] = local_44;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < phVar7->num_non_anchor_refs_l1[uVar13]);
                }
              }
              uVar13 = uVar13 + 1;
              MVar6 = MPP_OK;
            } while (uVar13 != local_40);
          }
        }
        else {
          MVar6 = MPP_ERR_VALUE;
          if (((byte)h264d_debug & 4) != 0) {
            fmt = "value error(%d).\n";
            uVar12 = 0x130;
LAB_00190910:
            _mpp_log_l(4,"h264d_sps",fmt,(char *)0x0,uVar12);
          }
        }
      }
      else {
LAB_0019035a:
        MVar6 = (phVar3->bitctx).ret;
      }
LAB_00190362:
      if (MVar6 < MPP_OK) {
        if (((byte)h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x17a);
        }
      }
      else {
        MVar6 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_44);
        (phVar3->bitctx).ret = MVar6;
        if (MVar6 != MPP_OK) goto LAB_001901c7;
        phVar7->mvc_vui_parameters_present_flag = local_44;
        MVar6 = MPP_OK;
      }
    }
    else {
LAB_001901c7:
      MVar6 = (phVar3->bitctx).ret;
    }
  }
  if (MPP_NOK < MVar6) {
    if ((phVar7->sps).Valid != 0) {
      phVar7->Valid = 1;
      currSlice->p_Vid->profile_idc = (phVar7->sps).profile_idc;
    }
    get_max_dec_frame_buf_size(&phVar7->sps);
    if (currSlice->p_Vid->subspsSet[(phVar7->sps).seq_parameter_set_id] == (h264_subsps_t *)0x0) {
      phVar8 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
      currSlice->p_Vid->subspsSet[(phVar7->sps).seq_parameter_set_id] = phVar8;
    }
    subset_sps = currSlice->p_Vid->subspsSet[(phVar7->sps).seq_parameter_set_id];
    if (subset_sps->Valid != 0) {
      recycle_subsps(subset_sps);
    }
    memcpy(subset_sps,phVar7,0x10c0);
    return MPP_OK;
  }
  uVar12 = 0x225;
joined_r0x00190285:
  if (((byte)h264d_debug & 4) != 0) {
    _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,uVar12);
  }
  recycle_subsps(currSlice->p_Cur->subsps);
  return MVar6;
}

Assistant:

MPP_RET process_subsps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    H264_subSPS_t *cur_subsps = NULL;
    H264_subSPS_t *p_subset = NULL;

    if (!currSlice->p_Cur->subsps)
        currSlice->p_Cur->subsps = mpp_calloc(H264_subSPS_t, 1);

    cur_subsps = currSlice->p_Cur->subsps;
    reset_cur_subpps_data(cur_subsps); //reset

    FUN_CHECK(ret = parser_sps(p_bitctx, &cur_subsps->sps, currSlice->p_Dec));
    FUN_CHECK(ret = parser_subsps_ext(p_bitctx, cur_subsps));
    if (cur_subsps->sps.Valid) {
        cur_subsps->Valid = 1;
        currSlice->p_Vid->profile_idc = cur_subsps->sps.profile_idc;
    }
    get_max_dec_frame_buf_size(&cur_subsps->sps);
    //!< make subSPS available
    if (!currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id])
        currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id] = mpp_calloc(H264_subSPS_t, 1);
    p_subset = currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id];
    if (p_subset->Valid) {
        recycle_subsps(p_subset);
    }
    memcpy(p_subset, cur_subsps, sizeof(H264_subSPS_t));

    return ret = MPP_OK;
__FAILED:
    recycle_subsps(currSlice->p_Cur->subsps);

    return ret;
}